

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O1

Ptr __thiscall hwnet::Buffer::New(Buffer *this,char *str,size_t len)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  Ptr PVar2;
  size_t local_50;
  unsigned_long local_48;
  Buffer *local_40;
  Ptr buff;
  
  if (str == (char *)0x0) {
    (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_48 = 0;
    local_40 = (Buffer *)0x0;
    local_50 = len;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<hwnet::Buffer,std::allocator<hwnet::Buffer>,unsigned_long&,unsigned_long&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&buff,&local_40,
               (allocator<hwnet::Buffer> *)
               ((long)&buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7),&local_50,&local_48);
    if (local_40 == (Buffer *)0x0) {
      (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      len = (size_t)extraout_RDX;
    }
    else {
      Append(local_40,str,len);
      peVar1 = buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_40;
      (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->buff).super___shared_ptr<hwnet::Buffer::bytes,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1;
      local_40 = (Buffer *)0x0;
      len = (size_t)extraout_RDX_00;
    }
    if (buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 buff.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      len = (size_t)extraout_RDX_01;
    }
  }
  PVar2.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)len;
  PVar2.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar2.super___shared_ptr<hwnet::Buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Buffer::Ptr New(const char *str, size_t len) {
		if(!str) {
			return nullptr;
		}
		auto buff = New(len);
		if(buff){
			buff->Append(const_cast<char*>(str),len);
			return buff;
		} else {
			return nullptr;
		}
	}